

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall CScheduler::serviceQueue(CScheduler *this)

{
  long lVar1;
  byte bVar2;
  cv_status cVar3;
  long in_FS_OFFSET;
  Function f;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  time_point timeToWaitFor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&lock.super_unique_lock,&this->newTaskMutex,
             "newTaskMutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
             ,0x19,false);
  this->nThreadsServicingQueue = this->nThreadsServicingQueue + 1;
  do {
    if ((this->stopRequested != false) ||
       ((bVar2 = 0, this->stopWhenEmpty == true &&
        ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      this->nThreadsServicingQueue = this->nThreadsServicingQueue + -1;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    while ((((bVar2 & 1) == 0 && (this->stopWhenEmpty == false)) &&
           ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))) {
      std::condition_variable::wait((unique_lock *)&this->newTaskScheduled);
      bVar2 = this->stopRequested;
    }
    do {
      bVar2 = this->stopRequested;
      if (((bool)bVar2 != false) ||
         ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
      goto LAB_00306ad6;
      timeToWaitFor.__d.__r =
           *(duration *)((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)
      ;
      cVar3 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->newTaskScheduled,&lock.super_unique_lock,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&timeToWaitFor);
    } while (cVar3 != timeout);
    bVar2 = this->stopRequested;
LAB_00306ad6:
    if (((bVar2 & 1) == 0) &&
       ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      ::wallet::_GLOBAL__N_1::std::function<void_()>::function
                ((function<void_()> *)&f,
                 (function<void_()> *)
                 &(this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                  _M_parent);
      std::
      _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
                          *)&this->taskQueue,
                         (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
                ((reverse_lock *)&timeToWaitFor,
                 (UniqueLock<AnnotatedMixin<std::mutex>_> *)&lock.super_unique_lock,"lock",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
                 ,0x3b);
      ::wallet::_GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)&f);
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock
                ((reverse_lock *)&timeToWaitFor);
      std::_Function_base::~_Function_base(&f.super__Function_base);
    }
  } while( true );
}

Assistant:

void CScheduler::serviceQueue()
{
    WAIT_LOCK(newTaskMutex, lock);
    ++nThreadsServicingQueue;

    // newTaskMutex is locked throughout this loop EXCEPT
    // when the thread is waiting or when the user's function
    // is called.
    while (!shouldStop()) {
        try {
            while (!shouldStop() && taskQueue.empty()) {
                // Wait until there is something to do.
                newTaskScheduled.wait(lock);
            }

            // Wait until either there is a new task, or until
            // the time of the first item on the queue:

            while (!shouldStop() && !taskQueue.empty()) {
                std::chrono::steady_clock::time_point timeToWaitFor = taskQueue.begin()->first;
                if (newTaskScheduled.wait_until(lock, timeToWaitFor) == std::cv_status::timeout) {
                    break; // Exit loop after timeout, it means we reached the time of the event
                }
            }

            // If there are multiple threads, the queue can empty while we're waiting (another
            // thread may service the task we were waiting on).
            if (shouldStop() || taskQueue.empty())
                continue;

            Function f = taskQueue.begin()->second;
            taskQueue.erase(taskQueue.begin());

            {
                // Unlock before calling f, so it can reschedule itself or another task
                // without deadlocking:
                REVERSE_LOCK(lock);
                f();
            }
        } catch (...) {
            --nThreadsServicingQueue;
            throw;
        }
    }
    --nThreadsServicingQueue;
    newTaskScheduled.notify_one();
}